

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGeneratorObjectStrings::Feed
          (cmMakefileTargetGeneratorObjectStrings *this,string *obj)

{
  cmOutputConverter *this_00;
  string local_60;
  string local_40;
  
  this_00 = this->OutputConverter;
  MaybeConvertToRelativePath(&local_60,this,obj);
  cmOutputConverter::ConvertToOutputFormat(&local_40,this_00,&local_60,RESPONSE);
  std::__cxx11::string::operator=((string *)&this->NextObject,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  if ((this->LengthLimit != 0xffffffffffffffff) &&
     (this->LengthLimit <
      (this->CurrentString)._M_string_length + (this->NextObject)._M_string_length + 1)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this->Strings,&this->CurrentString);
    std::__cxx11::string::assign((char *)&this->CurrentString);
    this->Space = "";
  }
  std::__cxx11::string::append((char *)&this->CurrentString);
  this->Space = " ";
  std::__cxx11::string::append((string *)&this->CurrentString);
  return;
}

Assistant:

void Feed(std::string const& obj)
  {
    // Construct the name of the next object.
    this->NextObject = this->OutputConverter->ConvertToOutputFormat(
      this->MaybeConvertToRelativePath(obj), cmOutputConverter::RESPONSE);

    // Roll over to next string if the limit will be exceeded.
    if (this->LengthLimit != std::string::npos &&
        (this->CurrentString.length() + 1 + this->NextObject.length() >
         this->LengthLimit)) {
      this->Strings.push_back(this->CurrentString);
      this->CurrentString = "";
      this->Space = "";
    }

    // Separate from previous object.
    this->CurrentString += this->Space;
    this->Space = " ";

    // Append this object.
    this->CurrentString += this->NextObject;
  }